

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O3

string * __thiscall
rest_rpc::rpc_service::msgpack_codec::pack_args_str<rest_rpc::result_code,dummy1&,void>
          (string *__return_storage_ptr__,msgpack_codec *this,result_code arg,dummy1 *args)

{
  undefined6 in_register_00000012;
  _Head_base<1UL,_dummy1_&,_false> _Var1;
  buffer_type buffer;
  undefined1 local_55;
  int local_54;
  sbuffer local_50;
  packer<msgpack::v1::sbuffer> local_38;
  tuple<int_&&,_dummy1_&> local_30;
  
  _Var1._M_head_impl._2_6_ = in_register_00000012;
  _Var1._M_head_impl._0_2_ = arg;
  msgpack::v1::sbuffer::sbuffer(&local_50,0x800);
  local_30.super__Tuple_impl<0UL,_int_&&,_dummy1_&>.super__Head_base<0UL,_int_&&,_false>.
  _M_head_impl = &local_54;
  local_54 = (int)this;
  local_38.m_stream = &local_50;
  local_30.super__Tuple_impl<0UL,_int_&&,_dummy1_&>.super__Tuple_impl<1UL,_dummy1_&>.
  super__Head_base<1UL,_dummy1_&,_false>._M_head_impl =
       (_Head_base<1UL,_dummy1_&,_false>)(_Head_base<1UL,_dummy1_&,_false>)_Var1._M_head_impl;
  msgpack::v1::adaptor::pack<std::tuple<int&&,dummy1&>,void>::operator()
            (&local_55,&local_38,&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_50.m_data,local_50.m_data + local_50.m_size);
  free(local_50.m_data);
  return __return_storage_ptr__;
}

Assistant:

static std::string pack_args_str(Arg arg, Args &&...args) {
    buffer_type buffer(init_size);
    msgpack::pack(buffer,
                  std::forward_as_tuple((int)arg, std::forward<Args>(args)...));
    return std::string(buffer.data(), buffer.size());
  }